

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Detail::Approx::setMargin(Approx *this,double margin)

{
  domain_error local_48 [16];
  ReusableStringStream local_38;
  string local_28 [32];
  
  if (0.0 <= margin) {
    this->m_margin = margin;
    return;
  }
  ReusableStringStream::ReusableStringStream(&local_38);
  std::operator<<((ostream *)local_38.m_oss,"Invalid Approx::margin: ");
  std::ostream::_M_insert<double>(margin);
  std::operator<<((ostream *)local_38.m_oss,'.');
  std::operator<<((ostream *)local_38.m_oss," Approx::Margin has to be non-negative.");
  std::__cxx11::stringbuf::str();
  std::domain_error::domain_error(local_48,local_28);
  throw_exception<std::domain_error>(local_48);
}

Assistant:

void Approx::setMargin(double margin) {
        CATCH_ENFORCE(margin >= 0,
            "Invalid Approx::margin: " << margin << '.'
            << " Approx::Margin has to be non-negative.");
        m_margin = margin;
    }